

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

CappedArray<char,_32UL> * __thiscall
kj::_::Stringifier::operator*
          (CappedArray<char,_32UL> *__return_storage_ptr__,Stringifier *this,double f)

{
  char *__s;
  size_t sVar1;
  double dVar2;
  
  __return_storage_ptr__->currentSize = 0x20;
  __s = __return_storage_ptr__->content;
  if (f < INFINITY) {
    if (-INFINITY < f) {
      if (NAN(f)) {
        builtin_strncpy(__s,"nan",4);
      }
      else {
        snprintf(__s,0x20,"%.*g",0xf);
        dVar2 = strtod(__s,(char **)0x0);
        if ((dVar2 != f) || (NAN(dVar2) || NAN(f))) {
          snprintf(__s,0x20,"%.*g",f,0x11);
        }
        anon_unknown_1::DelocalizeRadix(__s);
        anon_unknown_1::RemovePlus(__s);
      }
    }
    else {
      builtin_strncpy(__s,"-inf",5);
    }
  }
  else {
    builtin_strncpy(__s,"inf",4);
  }
  sVar1 = strlen(__s);
  __return_storage_ptr__->currentSize = sVar1;
  return __return_storage_ptr__;
}

Assistant:

CappedArray<char, kDoubleToBufferSize> Stringifier::operator*(double f) const {
  CappedArray<char, kDoubleToBufferSize> result;
  result.setSize(strlen(DoubleToBuffer(f, result.begin())));
  return result;
}